

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# power.c
# Opt level: O2

int envy_bios_parse_power_unk54(envy_bios *bios)

{
  byte bVar1;
  uint offs;
  int iVar2;
  int iVar3;
  int iVar4;
  envy_bios_power_unk54_entry *peVar5;
  ulong uVar6;
  
  offs = (bios->power).unk54.offset;
  iVar2 = -0x16;
  if (offs != 0) {
    bios_u8(bios,offs,&(bios->power).unk54.version);
    if ((bios->power).unk54.version == '\x10') {
      iVar2 = bios_u8(bios,(bios->power).unk54.offset + 1,&(bios->power).unk54.hlen);
      iVar3 = bios_u8(bios,(bios->power).unk54.offset + 2,&(bios->power).unk54.rlen);
      iVar4 = bios_u8(bios,(bios->power).unk54.offset + 3,&(bios->power).unk54.entriesnum);
      (bios->power).unk54.valid = iVar4 == 0 && (iVar3 == 0 && iVar2 == 0);
      bVar1 = (bios->power).unk54.entriesnum;
      peVar5 = (envy_bios_power_unk54_entry *)malloc((ulong)bVar1 << 2);
      (bios->power).unk54.entries = peVar5;
      iVar2 = 0;
      for (uVar6 = 0; bVar1 != uVar6; uVar6 = uVar6 + 1) {
        peVar5[uVar6].offset =
             (uint)(bios->power).unk54.rlen * (int)uVar6 +
             (uint)(bios->power).unk54.hlen + (bios->power).unk54.offset;
      }
    }
    else {
      fprintf(_stderr,"Unknown PSTATE MEMORY CLK FREQ table version 0x%x\n");
    }
  }
  return iVar2;
}

Assistant:

int envy_bios_parse_power_unk54(struct envy_bios *bios) {
	struct envy_bios_power_unk54 *unk54 = &bios->power.unk54;
	int i, err = 0;

	if (!unk54->offset)
		return -EINVAL;

	bios_u8(bios, unk54->offset + 0x0, &unk54->version);
	switch(unk54->version) {
	case 0x10:
		err |= bios_u8(bios, unk54->offset + 0x1, &unk54->hlen);
		err |= bios_u8(bios, unk54->offset + 0x2, &unk54->rlen);
		err |= bios_u8(bios, unk54->offset + 0x3, &unk54->entriesnum);
		unk54->valid = !err;
		break;
	default:
		ENVY_BIOS_ERR("Unknown PSTATE MEMORY CLK FREQ table version 0x%x\n", unk54->version);
		return -EINVAL;
	};

	err = 0;
	unk54->entries = malloc(unk54->entriesnum * sizeof(struct envy_bios_power_unk54_entry));
	for (i = 0; i < unk54->entriesnum; i++) {
		uint32_t data = unk54->offset + unk54->hlen + i * unk54->rlen;

		unk54->entries[i].offset = data;
	}

	return 0;
}